

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void __thiscall
MemoryArrayReader::MemoryArrayReader(MemoryArrayReader *this,char *buffer,long length)

{
  uchar *__dest;
  uint local_20;
  long length_local;
  char *buffer_local;
  MemoryArrayReader *this_local;
  
  FileReader::FileReader(&this->super_FileReader);
  (this->super_FileReader).super_FileReaderBase._vptr_FileReaderBase =
       (_func_int **)&PTR__MemoryArrayReader_009f4d50;
  TArray<unsigned_char,_unsigned_char>::TArray(&this->buf);
  local_20 = (uint)length;
  TArray<unsigned_char,_unsigned_char>::Resize(&this->buf,local_20);
  __dest = TArray<unsigned_char,_unsigned_char>::operator[](&this->buf,0);
  memcpy(__dest,buffer,length);
  (this->super_FileReader).Length = length;
  (this->super_FileReader).FilePos = 0;
  return;
}

Assistant:

MemoryArrayReader::MemoryArrayReader (const char *buffer, long length)
{
    buf.Resize(length);
    memcpy(&buf[0], buffer, length);
    Length=length;
    FilePos=0;
}